

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<const_QtPrivate::QMetaTypeInterface_*>::relocate
          (QArrayDataPointer<const_QtPrivate::QMetaTypeInterface_*> *this,qsizetype offset,
          QMetaTypeInterface ***data)

{
  bool bVar1;
  QMetaTypeInterface **first;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  QMetaTypeInterface **res;
  
  first = (QMetaTypeInterface **)(*(long *)(in_RDI + 8) + in_RSI * 8);
  QtPrivate::q_relocate_overlap_n<QtPrivate::QMetaTypeInterface_const*,long_long>
            (first,in_RDI,(QMetaTypeInterface **)0x3b5017);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<QtPrivate::QMetaTypeInterface_const*>,QtPrivate::QMetaTypeInterface_const*const*>
                        (data,(QArrayDataPointer<const_QtPrivate::QMetaTypeInterface_*> *)res),
     bVar1)) {
    *in_RDX = in_RSI * 8 + *in_RDX;
  }
  *(QMetaTypeInterface ***)(in_RDI + 8) = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }